

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem-builder.h
# Opt level: O0

void __thiscall
mp::ProblemBuilder<TestProblemBuilder,_BasicTestExpr<0>_>::SetComplementarity
          (ProblemBuilder<TestProblemBuilder,_BasicTestExpr<0>_> *this,int con_index,int var_index,
          ComplInfo info)

{
  Argument1 in_RDI;
  TestProblemBuilder *this_00;
  undefined1 local_41 [17];
  allocator<char> *in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  int local_18;
  int local_14 [4];
  
  this_01 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            &stack0xfffffffffffffffc;
  internal::Unused<int,int,mp::ComplInfo*>
            (local_14,&local_18,(ComplInfo **)&stack0xffffffffffffffe0);
  this_00 = (TestProblemBuilder *)local_41;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this_01,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  TestProblemBuilder::ReportUnhandledConstruct(this_00,in_RDI);
  std::__cxx11::string::~string((string *)(local_41 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_41);
  return;
}

Assistant:

void SetComplementarity(int con_index, int var_index, ComplInfo info) {
    internal::Unused(con_index, var_index, &info);
    MP_DISPATCH(ReportUnhandledConstruct("complementarity constraint"));
  }